

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

Regexp * __thiscall duckdb_re2::Regexp::Simplify(Regexp *this)

{
  Regexp *re;
  Regexp *this_00;
  SimplifyWalker sw;
  CoalesceWalker cw;
  Walker<duckdb_re2::Regexp_*> local_d8;
  Walker<duckdb_re2::Regexp_*> local_78;
  
  local_78._vptr_Walker = (_func_int **)&PTR__Walker_024c8b10;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78.stack_.c.
  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
  ::_M_initialize_map((_Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                       *)&local_78.stack_,0);
  local_78.stopped_early_ = false;
  local_78._vptr_Walker = (_func_int **)&PTR__Walker_024c8a50;
  local_78.max_visits_ = 1000000;
  re = Walker<duckdb_re2::Regexp_*>::WalkInternal(&local_78,this,(Regexp *)0x0,true);
  if (re != (Regexp *)0x0) {
    if (local_78.stopped_early_ != true) {
      local_d8._vptr_Walker = (_func_int **)&PTR__Walker_024c8b10;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_d8.stack_.c.
      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      std::
      _Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
      ::_M_initialize_map((_Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                           *)&local_d8.stack_,0);
      local_d8.stopped_early_ = false;
      local_d8._vptr_Walker = (_func_int **)&PTR__Walker_024c8aa8;
      local_d8.max_visits_ = 1000000;
      this_00 = Walker<duckdb_re2::Regexp_*>::WalkInternal(&local_d8,re,(Regexp *)0x0,true);
      Decref(re);
      if (this_00 == (Regexp *)0x0) {
LAB_01ce579f:
        this_00 = (Regexp *)0x0;
      }
      else if (local_d8.stopped_early_ == true) {
        Decref(this_00);
        goto LAB_01ce579f;
      }
      Walker<duckdb_re2::Regexp_*>::~Walker(&local_d8);
      goto LAB_01ce57aa;
    }
    Decref(re);
  }
  this_00 = (Regexp *)0x0;
LAB_01ce57aa:
  Walker<duckdb_re2::Regexp_*>::~Walker(&local_78);
  return this_00;
}

Assistant:

Regexp* Regexp::Simplify() {
  CoalesceWalker cw;
  Regexp* cre = cw.Walk(this, NULL);
  if (cre == NULL)
    return NULL;
  if (cw.stopped_early()) {
    cre->Decref();
    return NULL;
  }
  SimplifyWalker sw;
  Regexp* sre = sw.Walk(cre, NULL);
  cre->Decref();
  if (sre == NULL)
    return NULL;
  if (sw.stopped_early()) {
    sre->Decref();
    return NULL;
  }
  return sre;
}